

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_upgrade_tls(connectdata *conn)

{
  CURLcode local_1c;
  CURLcode result;
  imap_conn *imapc;
  connectdata *conn_local;
  
  local_1c = Curl_ssl_connect_nonblocking(conn,0,&(conn->proto).imapc.ssldone);
  if (local_1c == CURLE_OK) {
    if ((conn->proto).imapc.state != IMAP_UPGRADETLS) {
      state(conn,IMAP_UPGRADETLS);
    }
    if (((conn->proto).imapc.ssldone & 1U) != 0) {
      imap_to_imaps(conn);
      local_1c = imap_perform_capability(conn);
    }
  }
  return local_1c;
}

Assistant:

static CURLcode imap_perform_upgrade_tls(struct connectdata *conn)
{
  /* Start the SSL connection */
  struct imap_conn *imapc = &conn->proto.imapc;
  CURLcode result = Curl_ssl_connect_nonblocking(conn, FIRSTSOCKET,
                                                 &imapc->ssldone);

  if(!result) {
    if(imapc->state != IMAP_UPGRADETLS)
      state(conn, IMAP_UPGRADETLS);

    if(imapc->ssldone) {
      imap_to_imaps(conn);
      result = imap_perform_capability(conn);
    }
  }

  return result;
}